

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeSampledImageType(Builder *this,Id imageType)

{
  key_type kVar1;
  Id IVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *this_00;
  mapped_type_conflict *pmVar6;
  Id local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  Id local_44;
  Id debugResultId;
  key_type local_38 [4];
  Instruction *pIStack_28;
  int t;
  Instruction *type;
  Builder *pBStack_18;
  Id imageType_local;
  Builder *this_local;
  
  local_38[3] = 0;
  type._4_4_ = imageType;
  pBStack_18 = this;
  while( true ) {
    kVar1 = local_38[3];
    local_38[2] = 0x1b;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 2);
    sVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar3);
    if ((int)sVar4 <= (int)kVar1) {
      this_00 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      spv::Instruction::Instruction(this_00,IVar2,0,OpTypeSampledImage);
      pIStack_28 = this_00;
      spv::Instruction::addIdOperand(this_00,type._4_4_);
      local_38[0] = 0x1b;
      pmVar3 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_38);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar3,&stack0xffffffffffffffd8);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
                 &stack0xffffffffffffffc0,pIStack_28);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffc0);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                 &stack0xffffffffffffffc0);
      Module::mapInstruction(&this->module,pIStack_28);
      if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
        memset(&local_60,0,0x18);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60);
        IVar2 = makeCompositeDebugType
                          (this,&local_60,"type.sampled.image",NonSemanticShaderDebugInfo100Class,
                           true);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_60);
        local_44 = IVar2;
        local_64 = spv::Instruction::getResultId(pIStack_28);
        pmVar6 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->debugId,&local_64);
        *pmVar6 = IVar2;
      }
      IVar2 = spv::Instruction::getResultId(pIStack_28);
      return IVar2;
    }
    local_38[1] = 0x1b;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedTypes,local_38 + 1);
    ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar3,(long)(int)local_38[3]);
    pIStack_28 = *ppIVar5;
    IVar2 = spv::Instruction::getIdOperand(pIStack_28,0);
    if (IVar2 == type._4_4_) break;
    local_38[3] = local_38[3] + 1;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_28);
  return IVar2;
}

Assistant:

Id Builder::makeSampledImageType(Id imageType)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeSampledImage].size(); ++t) {
        type = groupedTypes[OpTypeSampledImage][t];
        if (type->getIdOperand(0) == imageType)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeSampledImage);
    type->addIdOperand(imageType);

    groupedTypes[OpTypeSampledImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeCompositeDebugType({}, "type.sampled.image", NonSemanticShaderDebugInfo100Class, true);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}